

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::AssertionInstanceExpression::bindPort
          (AssertionInstanceExpression *this,Symbol *symbol,SourceRange range,
          ASTContext *instanceCtx)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  SymbolKind SVar3;
  Compilation *compilation;
  group_type_pointer pgVar4;
  SyntaxNode *pSVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  string_view arg;
  not_null<const_slang::ast::Scope_*> *pnVar8;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var9;
  SourceLocation symbol_00;
  SourceLocation SVar10;
  bool bVar11;
  int iVar12;
  AssertionInstanceExpression *in_RAX;
  ulong uVar13;
  Type *pTVar14;
  Diagnostic *pDVar15;
  AssertionInstanceExpression *pAVar16;
  Expression *pEVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SourceLocation this_00;
  ulong uVar18;
  AssertionInstanceDetails *pAVar19;
  value_type_pointer ppVar20;
  DiagCode code;
  SyntaxKind SVar21;
  AssertionInstanceDetails *pAVar22;
  ASTContext *pAVar23;
  ExpressionSyntax *syntax;
  ASTContext *instanceCtx_00;
  uint uVar24;
  int *piVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  undefined1 auVar30 [16];
  SourceRange range_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  AssertionInstanceDetails details;
  SourceRange local_128;
  AssertionInstanceExpression *local_118;
  ConversionKind local_10c;
  ASTContext local_108;
  AssertionExpr *pAStack_d0;
  undefined1 local_c8 [48];
  void *pvStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  long local_78;
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined8 local_58;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  AssertionInstanceDetails *local_48;
  undefined1 uStack_40;
  
  this_00 = range.endLoc;
  local_128.endLoc = range.startLoc;
  pAVar19 = *(AssertionInstanceDetails **)((long)this_00 + 0x30);
  compilation = (Compilation *)**(undefined8 **)this_00;
  local_128.startLoc = (SourceLocation)symbol;
  if (pAVar19 == (AssertionInstanceDetails *)0x0) {
    pAVar19 = (AssertionInstanceDetails *)0x0;
    for (piVar25 = (int *)(*(undefined8 **)this_00)[1]; iVar12 = *piVar25, iVar12 != 0x58;
        piVar25 = *(int **)(*(long *)(piVar25 + 8) + 8)) {
      if (*(long *)(piVar25 + 8) == 0) {
        in_RAX = (AssertionInstanceExpression *)Expression::badExpr(compilation,(Expression *)0x0);
        goto LAB_0043a260;
      }
    }
    pAVar19 = *(AssertionInstanceDetails **)(piVar25 + 0x22);
LAB_0043a260:
    if (iVar12 != 0x58) {
      return &in_RAX->super_Expression;
    }
  }
  SVar10 = local_128.endLoc;
  symbol_00 = local_128.startLoc;
  pAVar22 = pAVar19->argDetails;
  if (pAVar19->argDetails == (AssertionInstanceDetails *)0x0) {
    pAVar22 = pAVar19;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this;
  uVar18 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar13 = uVar18 >> ((byte)(pAVar22->argumentMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar4 = (pAVar22->argumentMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
           .arrays.groups_;
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar18 & 0xff];
  instanceCtx_00 = (ASTContext *)0x0;
  do {
    pgVar1 = pgVar4 + uVar13;
    uVar26 = (uchar)uVar2;
    auVar30[0] = -(pgVar1->m[0].n == uVar26);
    uVar27 = (uchar)((uint)uVar2 >> 8);
    auVar30[1] = -(pgVar1->m[1].n == uVar27);
    uVar28 = (uchar)((uint)uVar2 >> 0x10);
    auVar30[2] = -(pgVar1->m[2].n == uVar28);
    uVar29 = (uchar)((uint)uVar2 >> 0x18);
    auVar30[3] = -(pgVar1->m[3].n == uVar29);
    auVar30[4] = -(pgVar1->m[4].n == uVar26);
    auVar30[5] = -(pgVar1->m[5].n == uVar27);
    auVar30[6] = -(pgVar1->m[6].n == uVar28);
    auVar30[7] = -(pgVar1->m[7].n == uVar29);
    auVar30[8] = -(pgVar1->m[8].n == uVar26);
    auVar30[9] = -(pgVar1->m[9].n == uVar27);
    auVar30[10] = -(pgVar1->m[10].n == uVar28);
    auVar30[0xb] = -(pgVar1->m[0xb].n == uVar29);
    auVar30[0xc] = -(pgVar1->m[0xc].n == uVar26);
    auVar30[0xd] = -(pgVar1->m[0xd].n == uVar27);
    auVar30[0xe] = -(pgVar1->m[0xe].n == uVar28);
    auVar30[0xf] = -(pgVar1->m[0xf].n == uVar29);
    uVar24 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
    if (uVar24 != 0) {
      ppVar20 = (pAVar22->argumentMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.elements_;
      do {
        uVar6 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        if ((AssertionInstanceExpression *)ppVar20[uVar13 * 0xf + (ulong)uVar6].first == this) {
          ppVar20 = ppVar20 + uVar13 * 0xf + (ulong)uVar6;
          goto LAB_0043a34a;
        }
        uVar24 = uVar24 - 1 & uVar24;
      } while (uVar24 != 0);
    }
    if ((pgVar4[uVar13].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7]) == 0) break;
    pAVar23 = (ASTContext *)
              (pAVar22->argumentMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
              .arrays.groups_size_mask;
    pnVar8 = &instanceCtx_00->scope;
    instanceCtx_00 = (ASTContext *)((long)&(instanceCtx_00->scope).ptr + 1);
    uVar13 = (long)&pnVar8->ptr + uVar13 + 1 & (ulong)pAVar23;
  } while (instanceCtx_00 <= pAVar23);
  ppVar20 = (value_type_pointer)0x0;
LAB_0043a34a:
  local_118 = in_RAX;
  if (ppVar20 == (value_type_pointer)0x0) {
    pAVar23 = pAVar22->prevContext;
    while (pAVar23 != (ASTContext *)0x0) {
      pAVar19 = pAVar23->assertionInstance;
      if ((pAVar19 == (AssertionInstanceDetails *)0x0) ||
         ((pAVar19->symbol != (Symbol *)0x0 && (pAVar19->symbol->kind == Checker)))) {
        ASTContext::resetFlags
                  ((ASTContext *)local_c8,pAVar23,
                   (bitmask<slang::ast::ASTFlags>)
                   ((bitmask<slang::ast::ASTFlags> *)((long)this_00 + 0x10))->m_bits);
        range_00.endLoc = (SourceLocation)local_c8;
        range_00.startLoc = SVar10;
        pAVar16 = (AssertionInstanceExpression *)
                  bindPort(this,(Symbol *)symbol_00,range_00,instanceCtx_00);
        return &pAVar16->super_Expression;
      }
      pAVar23 = pAVar19->prevContext;
    }
    goto LAB_0043a5f1;
  }
  pTVar14 = DeclaredType::getType((DeclaredType *)&this->arguments);
  if (pTVar14->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar14);
  }
  SVar3 = (pTVar14->canonical->super_Symbol).kind;
  if ((SVar3 == UntypedType) || (SVar3 == ErrorType)) {
LAB_0043a46b:
    uVar13 = ((bitmask<slang::ast::ASTFlags> *)((long)this_00 + 0x10))->m_bits;
    uVar24 = (uint)uVar13;
    if ((uVar24 >> 0x17 & 1) == 0) {
      local_108.scope.ptr =
           (ppVar20->second).
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
      p_Var9 = &(ppVar20->second).
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
      ;
      local_108.lookupIndex =
           (p_Var9->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
      local_108._12_4_ =
           *(undefined4 *)
            &(p_Var9->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
      local_108.flags.m_bits =
           (ppVar20->second).
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
      local_108.instanceOrProc =
           (ppVar20->second).
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
      local_108.firstTempVar =
           (ppVar20->second).
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
      local_108.randomizeDetails =
           (ppVar20->second).
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
      local_108.assertionInstance =
           (ppVar20->second).
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
      pAStack_d0 = (AssertionExpr *)
                   (ppVar20->second).
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                   _M_head_impl;
      if (pAStack_d0 == (AssertionExpr *)0x0) {
        pAVar16 = (AssertionInstanceExpression *)Expression::badExpr(compilation,(Expression *)0x0);
        return &pAVar16->super_Expression;
      }
      local_118 = (AssertionInstanceExpression *)CONCAT44(local_118._4_4_,pAStack_d0->kind);
      if (((pAStack_d0->kind == 0x1af) &&
          (pSVar5 = pAStack_d0[1].syntax, pSVar5->kind == SimpleSequenceExpr)) &&
         (pSVar5[1].parent == (SyntaxNode *)0x0)) {
        syntax = *(ExpressionSyntax **)(pSVar5 + 1);
      }
      else {
        syntax = (ExpressionSyntax *)0x0;
      }
      local_108.flags.m_bits = local_108.flags.m_bits | uVar13;
      local_c8._16_8_ = 0;
      local_c8._24_8_ = 0x3f;
      local_c8._32_8_ = 1;
      stack0xffffffffffffff60 = ZEXT816(0x49b460);
      local_90 = 0;
      local_88 = 0;
      local_80 = 0x3f;
      local_78 = 1;
      local_70 = ZEXT816(0x49b460);
      local_60 = 0;
      local_58 = 0;
      uStack_40 = 0;
      uStack_50 = local_128.startLoc._0_1_;
      uStack_4f = local_128.startLoc._1_7_;
      local_c8._8_8_ = 0;
      local_c8._0_8_ = this_00;
      local_c8._0_16_ = local_c8._0_16_ << 0x40;
      local_48 = local_108.assertionInstance;
      local_108.assertionInstance = (AssertionInstanceDetails *)local_c8;
      if (SVar3 - SequenceType < 2) {
        iVar12 = AssertionExpr::bind(pAStack_d0,(int)&local_108,(sockaddr *)0x0,0);
        SVar21 = PropertyType;
        if (SVar3 == SequenceType) {
          SVar21 = SequenceType;
        }
        pTVar14 = Compilation::getType(compilation,SVar21);
        local_10c = local_10c & 0xffffff00;
        pAVar16 = BumpAllocator::
                  emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::AssertionPortSymbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                            ((BumpAllocator *)compilation,pTVar14,(AssertionPortSymbol *)this,
                             (AssertionExpr *)CONCAT44(extraout_var,iVar12),(bool *)&local_10c,
                             &local_128);
        goto LAB_0043a73a;
      }
      if (SVar3 == EventType) {
        if ((~uVar24 & 0x24000) == 0) {
          iVar12 = TimingControl::bind((int)pAStack_d0,(sockaddr *)&local_108,
                                       local_128.startLoc._0_4_);
          pAVar16 = (AssertionInstanceExpression *)
                    BumpAllocator::
                    emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange&>
                              ((BumpAllocator *)compilation,compilation->voidType,
                               (TimingControl *)CONCAT44(extraout_var_00,iVar12),&local_128);
          goto LAB_0043a73a;
        }
        sourceRange_01.endLoc = local_128.endLoc;
        sourceRange_01.startLoc = local_128.startLoc;
        ASTContext::addDiag((ASTContext *)this_00,(DiagCode)0x500007,sourceRange_01);
      }
      else {
        if (SVar3 == UntypedType) {
          if (syntax == (ExpressionSyntax *)0x0) {
            if ((~uVar24 & 0x24000) == 0) {
              iVar12 = TimingControl::bind((int)pAStack_d0,(sockaddr *)&local_108,
                                           local_128.startLoc._0_4_);
              pAVar16 = (AssertionInstanceExpression *)
                        BumpAllocator::
                        emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange&>
                                  ((BumpAllocator *)compilation,compilation->voidType,
                                   (TimingControl *)CONCAT44(extraout_var_01,iVar12),&local_128);
            }
            else {
              iVar12 = AssertionExpr::bind(pAStack_d0,(int)&local_108,(sockaddr *)0x0,0);
              SVar21 = PropertyType;
              if ((int)local_118 == 0x1af) {
                SVar21 = SequenceType;
              }
              pTVar14 = Compilation::getType(compilation,SVar21);
              local_10c = local_10c & 0xffffff00;
              pAVar16 = BumpAllocator::
                        emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::AssertionPortSymbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                                  ((BumpAllocator *)compilation,pTVar14,(AssertionPortSymbol *)this,
                                   (AssertionExpr *)CONCAT44(extraout_var_02,iVar12),
                                   (bool *)&local_10c,&local_128);
            }
          }
          else {
            pAVar16 = (AssertionInstanceExpression *)
                      Expression::selfDetermined(compilation,syntax,&local_108,local_108.flags);
            (pAVar16->super_Expression).sourceRange.startLoc = local_128.startLoc;
            (pAVar16->super_Expression).sourceRange.endLoc = local_128.endLoc;
          }
          goto LAB_0043a73a;
        }
        if (syntax != (ExpressionSyntax *)0x0) {
          pAVar16 = (AssertionInstanceExpression *)
                    Expression::selfDetermined(compilation,syntax,&local_108,local_108.flags);
          (pAVar16->super_Expression).sourceRange.startLoc = local_128.startLoc;
          (pAVar16->super_Expression).sourceRange.endLoc = local_128.endLoc;
          if (((*(byte *)((long)this_00 + 0x12) & 0x10) == 0) &&
             (bVar11 = Type::isMatching((pAVar16->super_Expression).type.ptr,pTVar14), !bVar11)) {
            local_10c = Explicit;
            pAVar16 = (AssertionInstanceExpression *)
                      BumpAllocator::
                      emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                                ((BumpAllocator *)compilation,pTVar14,&local_10c,
                                 (Expression *)pAVar16,&local_128);
          }
          goto LAB_0043a73a;
        }
      }
      pAVar16 = (AssertionInstanceExpression *)Expression::badExpr(compilation,(Expression *)0x0);
LAB_0043a73a:
      if ((void *)local_70._8_8_ != (void *)0x0) {
        operator_delete((void *)local_70._8_8_,
                        ((local_78 * 0x178 + 0x186U) / 3 & 0xfffffffffffffff8) * 3);
      }
      if (pvStack_98 != (void *)0x0) {
        operator_delete(pvStack_98,((local_c8._32_8_ * 0x448 + 0x456U) / 9 & 0xfffffffffffffff8) * 9
                       );
      }
      return &pAVar16->super_Expression;
    }
    code.subsystem = Expressions;
    code.code = 0x8d;
  }
  else {
    if ((*(byte *)((long)this_00 + 0x12) & 8) != 0) {
      if (SVar3 == PredefinedIntegerType) {
        uVar13 = CONCAT71((int7)((ulong)pTVar14->canonical >> 8),
                          (uint)pTVar14->canonical[1].super_Symbol.name._M_len < 3);
      }
      else {
        uVar13 = 0;
      }
      pAVar16 = local_118;
      if ((char)uVar13 == '\0') {
        local_118 = (AssertionInstanceExpression *)CONCAT44(local_118._4_4_,(int)uVar13);
        sourceRange.endLoc = local_128.endLoc;
        sourceRange.startLoc = local_128.startLoc;
        pDVar15 = ASTContext::addDiag((ASTContext *)this_00,(DiagCode)0x50007,sourceRange);
        ast::operator<<(pDVar15,pTVar14);
        Diagnostic::addNote(pDVar15,(DiagCode)0x50001,
                            (SourceLocation)(this->super_Expression).syntax);
        pAVar16 = (AssertionInstanceExpression *)Expression::badExpr(compilation,(Expression *)0x0);
        uVar13 = (ulong)local_118 & 0xffffffff;
      }
      if ((char)uVar13 == '\0') {
        return &pAVar16->super_Expression;
      }
    }
    if (((*(byte *)((long)this_00 + 0x12) & 0x10) == 0) ||
       (this[1].super_Expression.sourceRange.startLoc.field_0x4 != '\0')) goto LAB_0043a46b;
    code.subsystem = Expressions;
    code.code = 8;
  }
  sourceRange_00.endLoc = local_128.endLoc;
  sourceRange_00.startLoc = local_128.startLoc;
  pDVar15 = ASTContext::addDiag((ASTContext *)this_00,code,sourceRange_00);
  arg._M_len = *(size_t *)&(this->super_Expression).type;
  arg._M_str = (char *)(this->super_Expression).constant;
  Diagnostic::operator<<(pDVar15,arg);
LAB_0043a5f1:
  pEVar17 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar17;
}

Assistant:

Expression& AssertionInstanceExpression::bindPort(const Symbol& symbol, SourceRange range,
                                                  const ASTContext& instanceCtx) {
    Compilation& comp = instanceCtx.getCompilation();

    auto inst = instanceCtx.assertionInstance;
    if (!inst) {
        // This is only possible if we're in a checker instance,
        // so look upward until we find it.
        auto sym = &instanceCtx.scope->asSymbol();
        while (sym->kind != SymbolKind::CheckerInstanceBody) {
            auto scope = sym->getParentScope();
            if (!scope)
                return badExpr(comp, nullptr);

            sym = &scope->asSymbol();
        }

        inst = &sym->as<CheckerInstanceBodySymbol>().assertionDetails;
    }

    // When looking up an argument reference from within another expanded
    // argument, use that original location's context.
    if (inst->argDetails)
        inst = inst->argDetails;

    // The only way to reference an assertion port should be from within
    // an assertion or checker instance.
    auto it = inst->argumentMap.find(&symbol);
    if (it == inst->argumentMap.end()) {
        // Walk through our previous assertion contexts to see if one of
        // them is a checker instance, in which case this argument might
        // be a reference to a checker port.
        auto ctx = inst->prevContext;
        while (ctx) {
            inst = ctx->assertionInstance;
            if (!inst || (inst->symbol && inst->symbol->kind == SymbolKind::Checker))
                return bindPort(symbol, range, ctx->resetFlags(instanceCtx.flags));

            ctx = inst->prevContext;
        }

        SLANG_ASSERT(false);
        return badExpr(comp, nullptr);
    }

    auto& formal = symbol.as<AssertionPortSymbol>();
    auto& type = formal.declaredType.getType();
    auto typeKind = type.getCanonicalType().kind;

    if (typeKind != SymbolKind::ErrorType && typeKind != SymbolKind::UntypedType) {
        if (instanceCtx.flags.has(ASTFlags::AssertionDelayOrRepetition)) {
            auto isAllowedIntType = [&] {
                if (typeKind != SymbolKind::PredefinedIntegerType)
                    return false;

                auto ik = type.getCanonicalType().as<PredefinedIntegerType>().integerKind;
                return ik == PredefinedIntegerType::Int || ik == PredefinedIntegerType::ShortInt ||
                       ik == PredefinedIntegerType::LongInt;
            };

            if (!isAllowedIntType()) {
                auto& diag = instanceCtx.addDiag(diag::AssertionDelayFormalType, range);
                diag << type;
                diag.addNote(diag::NoteDeclarationHere, formal.location);
                return badExpr(comp, nullptr);
            }
        }

        if (instanceCtx.flags.has(ASTFlags::LValue) && !formal.direction) {
            instanceCtx.addDiag(diag::AssertionPortTypedLValue, range) << formal.name;
            return badExpr(comp, nullptr);
        }
    }

    if (instanceCtx.flags.has(ASTFlags::RecursivePropertyArg)) {
        instanceCtx.addDiag(diag::RecursivePropArgExpr, range) << formal.name;
        return badExpr(comp, nullptr);
    }

    auto [propExpr, argCtx] = it->second;
    if (!propExpr) {
        // The expression can be null when making default instances of
        // sequences and properties. Just return an invalid expression.
        return badExpr(comp, nullptr);
    }

    auto [seqExpr, regExpr] = decomposePropExpr(*propExpr);

    // Inherit any AST flags that are specific to this argument's instantiation.
    argCtx.flags |= instanceCtx.flags;

    AssertionInstanceDetails details;
    details.argExpansionLoc = range.start();
    details.prevContext = &instanceCtx;
    details.argDetails = argCtx.assertionInstance;
    argCtx.assertionInstance = &details;

    switch (typeKind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind as a regular expression
            // if possible and fall back to an assertion expression if not.
            if (regExpr) {
                auto& result = selfDetermined(comp, *regExpr, argCtx, argCtx.flags);
                result.sourceRange = range;
                return result;
            }
            else if (instanceCtx.flags.has(ASTFlags::EventExpression) &&
                     instanceCtx.flags.has(ASTFlags::AllowClockingBlock)) {
                // In an event expression, a referenced argument gets interpreted
                // as an event expression itself and not as an assertion expression.
                auto& timing = TimingControl::bind(*propExpr, argCtx);
                return *comp.emplace<ClockingEventExpression>(comp.getVoidType(), timing, range);
            }
            else {
                auto& result = AssertionExpr::bind(*propExpr, argCtx);
                auto& resultType = seqExpr ? comp.getType(SyntaxKind::SequenceType)
                                           : comp.getType(SyntaxKind::PropertyType);
                return *comp.emplace<AssertionInstanceExpression>(resultType, formal, result,
                                                                  /* isRecursiveProperty */ false,
                                                                  range);
            }
        case SymbolKind::SequenceType:
        case SymbolKind::PropertyType: {
            auto& result = AssertionExpr::bind(*propExpr, argCtx);
            auto& resultType = typeKind == SymbolKind::SequenceType
                                   ? comp.getType(SyntaxKind::SequenceType)
                                   : comp.getType(SyntaxKind::PropertyType);

            return *comp.emplace<AssertionInstanceExpression>(resultType, formal, result,
                                                              /* isRecursiveProperty */ false,
                                                              range);
        }
        case SymbolKind::EventType:
            // If an event expression is allowed here, bind and return. Otherwise issue
            // an error, since an 'event' argument can only be used where event expressions
            // are allowed, regardless of what the actual argument expression looks like.
            if (instanceCtx.flags.has(ASTFlags::EventExpression) &&
                instanceCtx.flags.has(ASTFlags::AllowClockingBlock)) {
                auto& timing = TimingControl::bind(*propExpr, argCtx);
                return *comp.emplace<ClockingEventExpression>(comp.getVoidType(), timing, range);
            }

            instanceCtx.addDiag(diag::EventExprAssertionArg, range);
            return badExpr(comp, nullptr);
        default: {
            // Arguments should have already been checked for type correctness.
            if (!regExpr)
                return badExpr(comp, nullptr);

            auto& expr = selfDetermined(comp, *regExpr, argCtx, argCtx.flags);
            expr.sourceRange = range;

            if (!instanceCtx.flags.has(ASTFlags::LValue) && !expr.type->isMatching(type)) {
                return *comp.emplace<ConversionExpression>(type, ConversionKind::Explicit, expr,
                                                           range);
            }

            return expr;
        }
    }
}